

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O0

int __thiscall
ddd::DictionaryMLT<true,_false>::stat(DictionaryMLT<true,_false> *this,char *__file,stat *__buf)

{
  bool bVar1;
  uint32_t uVar2;
  pointer pDVar3;
  size_t sVar4;
  DaTrie<true,_false,_false> *pDVar5;
  pointer pDVar6;
  value_type *subtrie;
  size_t i;
  DaTrie<true,_false,_true> *in_stack_ffffffffffffffd0;
  DaTrie<true,_false,_false> *this_00;
  DaTrie<true,_false,_false> *local_18;
  
  *(undefined8 *)__file = *(undefined8 *)(this + 0x30);
  __file[8] = '\x01';
  __file[9] = '\0';
  __file[10] = '\0';
  __file[0xb] = '\0';
  __file[0xc] = '\0';
  __file[0xd] = '\0';
  __file[0xe] = '\0';
  __file[0xf] = '\0';
  std::
  unique_ptr<ddd::DaTrie<true,_false,_true>,_std::default_delete<ddd::DaTrie<true,_false,_true>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                *)0x176bfa);
  uVar2 = DaTrie<true,_false,_true>::num_nodes(in_stack_ffffffffffffffd0);
  *(ulong *)(__file + 0x10) = (ulong)uVar2;
  std::
  unique_ptr<ddd::DaTrie<true,_false,_true>,_std::default_delete<ddd::DaTrie<true,_false,_true>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                *)0x176c1d);
  uVar2 = DaTrie<true,_false,_true>::bc_size((DaTrie<true,_false,_true> *)0x176c25);
  *(ulong *)(__file + 0x18) = (ulong)uVar2;
  std::
  unique_ptr<ddd::DaTrie<true,_false,_true>,_std::default_delete<ddd::DaTrie<true,_false,_true>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                *)0x176c40);
  uVar2 = DaTrie<true,_false,_true>::bc_capa((DaTrie<true,_false,_true> *)0x176c48);
  *(ulong *)(__file + 0x20) = (ulong)uVar2;
  pDVar3 = std::
           unique_ptr<ddd::DaTrie<true,_false,_true>,_std::default_delete<ddd::DaTrie<true,_false,_true>_>_>
           ::operator->((unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                         *)0x176c63);
  uVar2 = DaTrie<true,_false,_true>::bc_emps(pDVar3);
  *(ulong *)(__file + 0x28) = (ulong)uVar2;
  std::
  unique_ptr<ddd::DaTrie<true,_false,_true>,_std::default_delete<ddd::DaTrie<true,_false,_true>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                *)0x176c86);
  uVar2 = DaTrie<true,_false,_true>::tail_size((DaTrie<true,_false,_true> *)0x176c8e);
  *(ulong *)(__file + 0x30) = (ulong)uVar2;
  std::
  unique_ptr<ddd::DaTrie<true,_false,_true>,_std::default_delete<ddd::DaTrie<true,_false,_true>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                *)0x176ca9);
  uVar2 = DaTrie<true,_false,_true>::tail_capa((DaTrie<true,_false,_true> *)0x176cb1);
  *(ulong *)(__file + 0x38) = (ulong)uVar2;
  pDVar3 = std::
           unique_ptr<ddd::DaTrie<true,_false,_true>,_std::default_delete<ddd::DaTrie<true,_false,_true>_>_>
           ::operator->((unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                         *)0x176ccc);
  uVar2 = DaTrie<true,_false,_true>::tail_emps(pDVar3);
  *(ulong *)(__file + 0x40) = (ulong)uVar2;
  std::
  unique_ptr<ddd::DaTrie<true,_false,_true>,_std::default_delete<ddd::DaTrie<true,_false,_true>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                *)0x176cef);
  sVar4 = DaTrie<true,_false,_true>::size_in_bytes(in_stack_ffffffffffffffd0);
  *(size_t *)(__file + 0x48) = sVar4;
  local_18 = (DaTrie<true,_false,_false> *)0x0;
  while (this_00 = local_18,
        pDVar5 = (DaTrie<true,_false,_false> *)
                 std::
                 vector<std::unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>_>_>
                 ::size((vector<std::unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>_>_>
                         *)(this + 0x10)), this_00 < pDVar5) {
    std::
    vector<std::unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>_>_>
    ::operator[]((vector<std::unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>_>_>
                  *)(this + 0x10),(size_type)local_18);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
                        *)0x176d57);
    if (bVar1) {
      std::
      unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
      ::operator->((unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
                    *)0x176d6a);
      uVar2 = DaTrie<true,_false,_false>::num_nodes(this_00);
      *(ulong *)(__file + 0x10) = (ulong)uVar2 + *(long *)(__file + 0x10);
      std::
      unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
      ::operator->((unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
                    *)0x176d8d);
      uVar2 = DaTrie<true,_false,_false>::bc_size((DaTrie<true,_false,_false> *)0x176d95);
      *(ulong *)(__file + 0x18) = (ulong)uVar2 + *(long *)(__file + 0x18);
      std::
      unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
      ::operator->((unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
                    *)0x176db0);
      uVar2 = DaTrie<true,_false,_false>::bc_capa((DaTrie<true,_false,_false> *)0x176db8);
      *(ulong *)(__file + 0x20) = (ulong)uVar2 + *(long *)(__file + 0x20);
      pDVar6 = std::
               unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
               ::operator->((unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
                             *)0x176dd3);
      uVar2 = DaTrie<true,_false,_false>::bc_emps(pDVar6);
      *(ulong *)(__file + 0x28) = (ulong)uVar2 + *(long *)(__file + 0x28);
      std::
      unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
      ::operator->((unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
                    *)0x176df6);
      uVar2 = DaTrie<true,_false,_false>::tail_size((DaTrie<true,_false,_false> *)0x176dfe);
      *(ulong *)(__file + 0x30) = (ulong)uVar2 + *(long *)(__file + 0x30);
      std::
      unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
      ::operator->((unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
                    *)0x176e19);
      uVar2 = DaTrie<true,_false,_false>::tail_capa((DaTrie<true,_false,_false> *)0x176e21);
      *(ulong *)(__file + 0x38) = (ulong)uVar2 + *(long *)(__file + 0x38);
      pDVar6 = std::
               unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
               ::operator->((unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
                             *)0x176e3c);
      uVar2 = DaTrie<true,_false,_false>::tail_emps(pDVar6);
      *(ulong *)(__file + 0x40) = (ulong)uVar2 + *(long *)(__file + 0x40);
      std::
      unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
      ::operator->((unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
                    *)0x176e5f);
      sVar4 = DaTrie<true,_false,_false>::size_in_bytes(this_00);
      *(size_t *)(__file + 0x48) = sVar4 + *(long *)(__file + 0x48);
      *(long *)(__file + 8) = *(long *)(__file + 8) + 1;
    }
    *(long *)(__file + 0x48) = *(long *)(__file + 0x48) + 1;
    local_18 = (DaTrie<true,_false,_false> *)
               ((long)&(local_18->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl
                       .super__Vector_impl_data._M_start + 1);
  }
  *(long *)(__file + 0x48) = *(long *)(__file + 0x48) + 8;
  *(long *)(__file + 0x48) = *(long *)(__file + 0x48) + 4;
  *(long *)(__file + 0x48) = *(long *)(__file + 0x48) + 8;
  return (int)__file;
}

Assistant:

void stat(Stat& ret) const {
    ret.num_keys = num_keys_;
    ret.num_tries = 1;
    ret.num_nodes = prefix_subtrie_->num_nodes();
    ret.bc_size = prefix_subtrie_->bc_size();
    ret.bc_capa = prefix_subtrie_->bc_capa();
    ret.bc_emps = prefix_subtrie_->bc_emps();
    ret.tail_size = prefix_subtrie_->tail_size();
    ret.tail_capa = prefix_subtrie_->tail_capa();
    ret.tail_emps = prefix_subtrie_->tail_emps();
    ret.size_in_bytes = prefix_subtrie_->size_in_bytes();

    for (size_t i = 0; i < suffix_subtries_.size(); ++i) {
      auto& subtrie = suffix_subtries_[i];
      if (subtrie) {
        ret.num_nodes += subtrie->num_nodes();
        ret.bc_size += subtrie->bc_size();
        ret.bc_capa += subtrie->bc_capa();
        ret.bc_emps += subtrie->bc_emps();
        ret.tail_size += subtrie->tail_size();
        ret.tail_capa += subtrie->tail_capa();
        ret.tail_emps += subtrie->tail_emps();
        ret.size_in_bytes += subtrie->size_in_bytes();
        ++ret.num_tries;
      }
      ret.size_in_bytes += sizeof(bool);
    }

    ret.size_in_bytes += sizeof(suffix_subtries_.size());
    ret.size_in_bytes += sizeof(suffix_head_);
    ret.size_in_bytes += sizeof(num_keys_);
  }